

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRT.cpp
# Opt level: O2

EndPoint __thiscall Outputs::CRT::CRT::end_point(CRT *this,uint16_t data_offset)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  EndPoint EVar4;
  
  uVar1 = Flywheel::get_current_output_position
                    ((this->horizontal_flywheel_)._M_t.
                     super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                     .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl);
  if (0xfffe < (int)uVar1) {
    uVar1 = 0xffff;
  }
  iVar2 = Flywheel::get_current_output_position
                    ((this->vertical_flywheel_)._M_t.
                     super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                     .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl);
  iVar2 = iVar2 / this->vertical_flywheel_output_divider_;
  if (0xfffe < iVar2) {
    iVar2 = 0xffff;
  }
  uVar3 = ((this->phase_numerator_ -
           (long)(this->cycles_since_horizontal_sync_ % this->time_multiplier_) *
           this->colour_cycle_numerator_) * 0x40) / this->phase_denominator_;
  if (this->is_alternate_line_ != false) {
    uVar3 = (ulong)(uint)-(int)uVar3;
  }
  EVar4._0_8_ = uVar3 << 0x30 | CONCAT62(in_register_00000032,data_offset) << 0x20 |
                (ulong)(uint)(iVar2 << 0x10) | (ulong)(uVar1 & 0xffff);
  EVar4.cycles_since_end_of_horizontal_retrace =
       (uint16_t)(this->cycles_since_horizontal_sync_ / this->time_multiplier_);
  return EVar4;
}

Assistant:

Outputs::Display::ScanTarget::Scan::EndPoint CRT::end_point(uint16_t data_offset) {
	Display::ScanTarget::Scan::EndPoint end_point;

	// Clamp the available range on endpoints. These will almost always be within range, but may go
	// out during times of resync.
	end_point.x = uint16_t(std::min(horizontal_flywheel_->get_current_output_position(), 65535));
	end_point.y = uint16_t(std::min(vertical_flywheel_->get_current_output_position() / vertical_flywheel_output_divider_, 65535));
	end_point.data_offset = data_offset;

	// Ensure .composite_angle is sampled at the location indicated by .cycles_since_end_of_horizontal_retrace.
	// TODO: I could supply time_multiplier_ as a modal and just not round .cycles_since_end_of_horizontal_retrace. Would that be better?
	const auto lost_precision = cycles_since_horizontal_sync_ % time_multiplier_;
	end_point.composite_angle = int16_t(((phase_numerator_ - lost_precision * colour_cycle_numerator_) << 6) / phase_denominator_) * (is_alternate_line_ ? -1 : 1);
	end_point.cycles_since_end_of_horizontal_retrace = uint16_t(cycles_since_horizontal_sync_ / time_multiplier_);

	return end_point;
}